

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quick_start.cxx
# Opt level: O1

int main(int argc,char **argv)

{
  size_t sVar1;
  undefined8 this;
  int iVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  int *piVar3;
  int extraout_EDX;
  int extraout_EDX_00;
  initializer_list<std::shared_ptr<nuraft::buffer>_> __l;
  allocator_type local_369;
  ptr<buffer> log;
  ptr<raft_server> server;
  shared_ptr<nuraft::buffer> local_348;
  ptr<logger> local_338;
  ptr<state_mgr> local_328;
  string msg;
  undefined8 local_2e8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_2e0;
  vector<std::shared_ptr<nuraft::buffer>,_std::allocator<std::shared_ptr<nuraft::buffer>_>_>
  local_2d0;
  raft_launcher launcher;
  undefined1 local_288 [52];
  undefined4 local_254;
  undefined8 local_250;
  undefined8 uStack_248;
  undefined2 local_240;
  undefined4 local_23c;
  undefined2 local_238;
  undefined1 local_236;
  undefined4 local_234;
  undefined7 local_230;
  undefined1 uStack_229;
  undefined7 uStack_228;
  undefined1 local_220 [16];
  buffer_serializer bs_log;
  options asio_opt;
  
  this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x58);
  this_00->_M_use_count = 1;
  this_00->_M_weak_count = 1;
  this_00->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_005bca20;
  this_00[1]._vptr__Sp_counted_base = (_func_int **)&PTR__echo_state_machine_005bcad0;
  this_00[1]._M_use_count = 0;
  this_00[1]._M_weak_count = 0;
  this_00[2]._vptr__Sp_counted_base = (_func_int **)0x0;
  this_00[2]._M_use_count = 0;
  this_00[2]._M_weak_count = 0;
  this_00[3]._vptr__Sp_counted_base = (_func_int **)0x0;
  this_00[3]._M_use_count = 0;
  this_00[3]._M_weak_count = 0;
  this_00[4]._vptr__Sp_counted_base = (_func_int **)0x0;
  this_00[4]._M_use_count = 0;
  this_00[4]._M_weak_count = 0;
  this_00[5]._vptr__Sp_counted_base = (_func_int **)0x0;
  local_288._0_4_ = 1;
  asio_opt.thread_pool_size_ = 0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<nuraft::inmem_state_mgr,std::allocator<nuraft::inmem_state_mgr>,int,char_const(&)[16]>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&asio_opt.worker_start_,
             (inmem_state_mgr **)&asio_opt,(allocator<nuraft::inmem_state_mgr> *)&launcher,
             (int *)local_288,(char (*) [16])"localhost:12345");
  this = asio_opt.worker_start_.super__Function_base._M_functor._M_unused._0_8_;
  sVar1 = asio_opt.thread_pool_size_;
  asio_opt.server_cert_file_._M_dataplus._M_p = (pointer)&asio_opt.server_cert_file_.field_2;
  asio_opt.worker_stop_._M_invoker._0_2_ = 0;
  asio_opt._66_8_ = 0;
  asio_opt.worker_stop_.super__Function_base._M_functor._8_8_ = 0;
  asio_opt.worker_stop_.super__Function_base._M_manager._0_2_ = 0;
  asio_opt.worker_stop_.super__Function_base._M_manager._2_6_ = 0;
  asio_opt.worker_start_._M_invoker = (_Invoker_type)0x0;
  asio_opt.worker_stop_.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
  asio_opt.worker_start_.super__Function_base._M_functor._8_8_ = 0;
  asio_opt.worker_start_.super__Function_base._M_manager = (_Manager_type)0x0;
  asio_opt.thread_pool_size_ = 0;
  asio_opt.worker_start_.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
  asio_opt.server_cert_file_._M_string_length = 0;
  asio_opt.server_cert_file_.field_2._M_local_buf[0] = '\0';
  asio_opt.server_key_file_._M_dataplus._M_p = (pointer)&asio_opt.server_key_file_.field_2;
  asio_opt.server_key_file_._M_string_length = 0;
  asio_opt.server_key_file_.field_2._M_local_buf[0] = '\0';
  asio_opt.root_cert_file_._M_dataplus._M_p = (pointer)&asio_opt.root_cert_file_.field_2;
  asio_opt.root_cert_file_._M_string_length = 0;
  asio_opt.root_cert_file_.field_2._M_local_buf[0] = '\0';
  asio_opt.write_req_meta_.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
  asio_opt.write_req_meta_.super__Function_base._M_functor._8_8_ = 0;
  asio_opt.write_req_meta_.super__Function_base._M_manager = (_Manager_type)0x0;
  asio_opt.write_req_meta_._M_invoker = (_Invoker_type)0x0;
  asio_opt.read_req_meta_.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
  asio_opt.read_req_meta_.super__Function_base._M_functor._8_8_ = 0;
  asio_opt.read_req_meta_.super__Function_base._M_manager = (_Manager_type)0x0;
  asio_opt.read_req_meta_._M_invoker = (_Invoker_type)0x0;
  asio_opt.invoke_req_cb_on_empty_meta_ = true;
  asio_opt.read_resp_meta_.super__Function_base._M_manager = (_Manager_type)0x0;
  asio_opt.read_resp_meta_._M_invoker = (_Invoker_type)0x0;
  asio_opt.read_resp_meta_.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
  asio_opt.read_resp_meta_.super__Function_base._M_functor._8_8_ = 0;
  asio_opt.write_resp_meta_.super__Function_base._M_manager = (_Manager_type)0x0;
  asio_opt.write_resp_meta_._M_invoker = (_Invoker_type)0x0;
  asio_opt.write_resp_meta_.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
  asio_opt.write_resp_meta_.super__Function_base._M_functor._8_8_ = 0;
  asio_opt.invoke_resp_cb_on_empty_meta_ = true;
  memset(&asio_opt.verify_sn_,0,0x81);
  local_288._0_8_ = 0xfa000001f4;
  local_288._8_8_ = (void *)0x320000007d;
  local_288._16_8_ = 0x1869f000003e8;
  local_288._24_8_ = (_Manager_type)0x0;
  local_288[0x20] = 0;
  local_288._36_8_ = 0x186a000000064;
  local_288._44_8_ = 0xc800000bb8;
  local_254 = 2000;
  local_250 = 0;
  uStack_248 = 0;
  local_240 = 1;
  local_23c = 10;
  local_238 = 1;
  local_236 = 0;
  local_234 = 1;
  local_230 = 0;
  uStack_229 = 0;
  uStack_228 = 0;
  nuraft::raft_launcher::raft_launcher(&launcher);
  local_328.super___shared_ptr<nuraft::state_mgr,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)(this_00 + 1);
  if (__libc_single_threaded == '\0') {
    LOCK();
    this_00->_M_use_count = this_00->_M_use_count + 1;
    UNLOCK();
  }
  else {
    this_00->_M_use_count = this_00->_M_use_count + 1;
  }
  local_338.super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)sVar1;
  local_338.super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this;
  if ((void *)this != (void *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)(this + 8) = *(int *)(this + 8) + 1;
      UNLOCK();
    }
    else {
      *(int *)(this + 8) = *(int *)(this + 8) + 1;
    }
  }
  local_2e8 = 0;
  p_Stack_2e0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  msg._M_dataplus._M_p = msg._M_dataplus._M_p & 0xffffffffffffff00;
  msg._M_string_length = 0;
  msg.field_2._M_allocated_capacity = 0;
  msg.field_2._8_8_ = 0;
  local_328.super___shared_ptr<nuraft::state_mgr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       this_00;
  nuraft::raft_launcher::init
            ((raft_launcher *)&server,(ptr<state_machine> *)&launcher,&local_328,&local_338,
             (int)&local_2e8,(options *)0x3039,(raft_params *)&asio_opt,(init_options *)local_288);
  if (msg.field_2._8_8_ != 0) {
    (*(code *)msg.field_2._8_8_)(&msg._M_string_length,&msg._M_string_length,3);
  }
  if (p_Stack_2e0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_2e0);
  }
  if (local_338.super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_338.super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_328.super___shared_ptr<nuraft::state_mgr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_328.super___shared_ptr<nuraft::state_mgr,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((((server.super___shared_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
       initialized_)._M_base._M_i & 1U) == 0) {
    do {
      msg._M_dataplus._M_p = (pointer)0x0;
      msg._M_string_length = 100000000;
      do {
        iVar2 = nanosleep((timespec *)&msg,(timespec *)&msg);
        if (iVar2 != -1) break;
        piVar3 = __errno_location();
      } while (*piVar3 == 4);
    } while ((((server.super___shared_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              initialized_)._M_base._M_i & 1U) == 0);
  }
  msg._M_dataplus._M_p = (pointer)&msg.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&msg,"hello world","");
  nuraft::buffer::alloc((buffer *)&log,msg._M_string_length + 4);
  nuraft::buffer_serializer::buffer_serializer(&bs_log,&log,LITTLE);
  nuraft::buffer_serializer::put_str(&bs_log,&msg);
  local_348.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       log.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_348.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       log.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (log.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (log.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (log.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                     ._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (log.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (log.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                     ._M_pi)->_M_use_count + 1;
    }
  }
  __l._M_len = 1;
  __l._M_array = &local_348;
  std::vector<std::shared_ptr<nuraft::buffer>,_std::allocator<std::shared_ptr<nuraft::buffer>_>_>::
  vector(&local_2d0,__l,&local_369);
  nuraft::raft_server::append_entries
            ((raft_server *)local_220,
             (vector<std::shared_ptr<nuraft::buffer>,_std::allocator<std::shared_ptr<nuraft::buffer>_>_>
              *)server.super___shared_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  if ((element_type *)local_220._8_8_ != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_220._8_8_);
  }
  std::vector<std::shared_ptr<nuraft::buffer>,_std::allocator<std::shared_ptr<nuraft::buffer>_>_>::
  ~vector(&local_2d0);
  iVar2 = extraout_EDX;
  if (local_348.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_348.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
    iVar2 = extraout_EDX_00;
  }
  nuraft::raft_launcher::shutdown(&launcher,5,iVar2);
  if (log.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (log.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
    ;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)msg._M_dataplus._M_p != &msg.field_2) {
    operator_delete(msg._M_dataplus._M_p);
  }
  if (server.super___shared_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (server.super___shared_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (launcher.raft_instance_.super___shared_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (launcher.raft_instance_.
               super___shared_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
              );
  }
  if (launcher.asio_listener_.super___shared_ptr<nuraft::rpc_listener,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (launcher.asio_listener_.
               super___shared_ptr<nuraft::rpc_listener,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (launcher.asio_svc_.super___shared_ptr<nuraft::asio_service,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (launcher.asio_svc_.
               super___shared_ptr<nuraft::asio_service,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  nuraft::asio_service_options::~asio_service_options(&asio_opt);
  if ((void *)this != (void *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this);
  }
  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  return 0;
}

Assistant:

int main(int argc, char** argv) {
    // Replace with your logger, state machine, and state manager.
    ptr<logger>         my_logger = nullptr;
    ptr<state_machine>  my_state_machine = cs_new<echo_state_machine>();
    ptr<state_mgr>      my_state_manager =
        cs_new<inmem_state_mgr>(1, "localhost:12345");

    asio_service::options   asio_opt;   // your Asio options
    raft_params             params;     // your Raft parameters

    // Initialize Raft server listening on port 12345.
    // It will organize a single-node Raft cluster.
    raft_launcher       launcher;
    int                 port_number = 12345;
    ptr<raft_server>    server = launcher.init(my_state_machine,
                                               my_state_manager,
                                               my_logger,
                                               port_number,
                                               asio_opt,
                                               params);
    // Need to wait for initialization.
    while (!server->is_initialized()) {
        std::this_thread::sleep_for( std::chrono::milliseconds(100) );
    }

    // Append a log, containing a string `hello world` and its 4-byte length.
    std::string msg = "hello world";
    ptr<buffer> log = buffer::alloc(sizeof(int) + msg.size());
    buffer_serializer bs_log(log);
    bs_log.put_str(msg);
    server->append_entries({log});

    // Shutdown.
    launcher.shutdown();
    return 0;
}